

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::subspan
          (span<int,_18446744073709551615UL> *this,size_type offset,size_type count)

{
  ulong uVar1;
  logic_error *this_00;
  size_type in_RCX;
  size_type extraout_RDX;
  size_type count_00;
  span<int,_18446744073709551615UL> sVar2;
  span<int,_18446744073709551615UL> local_20;
  
  uVar1 = *(ulong *)(offset + 8);
  count_00 = uVar1 - count;
  if ((count <= uVar1) &&
     ((in_RCX == 0xffffffffffffffff || (count_00 = in_RCX, in_RCX + count <= uVar1)))) {
    span(&local_20,(pointer)(count * 4 + *(long *)offset),count_00);
    this->data_ = local_20.data_;
    this->size_ = local_20.size_;
    sVar2.size_ = extraout_RDX;
    sVar2.data_ = (pointer)this;
    return sVar2;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  detail::contract_violation::contract_violation
            ((contract_violation *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1209: Precondition violation."
            );
  std::logic_error::logic_error(this_00,(logic_error *)&local_20);
  *(undefined ***)this_00 = &PTR__logic_error_001b6c70;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    subspan( size_type offset, size_type count = static_cast<size_type>(dynamic_extent) ) const
    {
        span_EXPECTS(
            ( ( detail::is_positive( offset ) && offset <= size() ) ) &&
            ( count == static_cast<size_type>(dynamic_extent) || ( detail::is_positive( count ) && offset + count <= size() ) )
        );

        return span< element_type, dynamic_extent >(
            data() + offset, count == static_cast<size_type>(dynamic_extent) ? size() - offset : count );
    }